

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_in_memory_computer.h
# Opt level: O0

void __thiscall
directed_flag_complex_in_memory_computer::store_coboundaries_in_cache_t::operator()
          (store_coboundaries_in_cache_t *this,vertex_index_t *first_vertex,int size,
          pair<int,_float> *param_4)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  vertex_index_t vVar4;
  ostream *poVar5;
  reference pvVar6;
  int in_EDX;
  vertex_index_t *in_RSI;
  int *in_RDI;
  short thread_index;
  directed_flag_complex_coboundary_cell_t cb;
  int b;
  size_t vertex_offset;
  int j_1;
  size_t bits;
  size_t offset;
  int i;
  int j;
  vector<unsigned_long,_std::allocator<unsigned_long>_> vertex_offsets;
  directed_flag_complex_cell_t cell;
  undefined4 in_stack_fffffffffffffeb8;
  undefined2 in_stack_fffffffffffffebc;
  vertex_index_t in_stack_fffffffffffffebe;
  undefined4 in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec4;
  int in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffed0;
  directed_flag_complex_coboundary_cell_t *in_stack_ffffffffffffff00;
  size_t in_stack_ffffffffffffff08;
  directed_flag_complex_in_memory_t<std::pair<int,_float>_> *in_stack_ffffffffffffff10;
  directed_flag_complex_coboundary_cell_t local_b0;
  int local_8c;
  long local_88;
  int local_7c;
  ulong local_78;
  ulong local_70;
  uint local_68;
  ulong local_58;
  int local_4c;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  directed_flag_complex_cell_t local_30;
  int local_14;
  vertex_index_t *local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  if (((*(byte *)(in_RDI + 1) & 1) != 0) && ((*in_RDI + 1) % 10000 == 0)) {
    poVar5 = std::operator<<((ostream *)&std::cout,"\x1b[K");
    poVar5 = std::operator<<(poVar5,"dimension ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,in_RDI[2]);
    poVar5 = std::operator<<(poVar5,": computed ca. ");
    std::ostream::operator<<(poVar5,*(long *)(in_RDI + 0xe) * (long)(*in_RDI + 1));
    if (*(long *)(in_RDI + 0xc) != 0) {
      poVar5 = std::operator<<((ostream *)&std::cout,"/");
      std::ostream::operator<<(poVar5,*(ulong *)(in_RDI + 0xc));
    }
    poVar5 = std::operator<<((ostream *)&std::cout," coboundaries");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::flush<char,std::char_traits<char>>);
    std::operator<<(poVar5,"\r");
  }
  directed_flag_complex_cell_t::directed_flag_complex_cell_t(&local_30,local_10);
  compressed_sparse_matrix<int>::append_column
            ((compressed_sparse_matrix<int> *)
             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1b2046);
  for (local_4c = 0; local_4c < local_14; local_4c = local_4c + 1) {
    local_58 = (ulong)(local_10[local_4c] >> 6);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
               (value_type_conflict3 *)
               CONCAT26(in_stack_fffffffffffffebe,
                        CONCAT24(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)));
  }
  for (local_68 = 0; (int)local_68 <= local_14; local_68 = local_68 + 1) {
    for (local_70 = 0; local_70 < *(ulong *)(*(long *)(in_RDI + 6) + 0xa0); local_70 = local_70 + 1)
    {
      local_7c = 0;
      for (local_78 = 0xffffffffffffffff; local_78 != 0 && local_7c < local_14;
          local_78 = in_stack_ffffffffffffff08 & local_78) {
        pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&local_48,(long)local_7c);
        if (*pvVar6 == local_70) {
          in_stack_ffffffffffffff10 =
               (directed_flag_complex_in_memory_t<std::pair<int,_float>_> *)
               (ulong)local_10[local_7c];
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                    (&local_48,(long)local_7c);
          local_78 = (1L << ((byte)in_stack_ffffffffffffff10 & 0x3f) ^ 0xffffffffffffffffU) &
                     local_78;
        }
        if (local_7c < (int)local_68) {
          in_stack_ffffffffffffff08 =
               directed_graph_t::get_outgoing_chunk
                         ((directed_graph_t *)
                          CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                          in_stack_fffffffffffffebe,0x1b221d);
        }
        else {
          in_stack_ffffffffffffff08 =
               directed_graph_t::get_incoming_chunk
                         ((directed_graph_t *)
                          CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                          in_stack_fffffffffffffebe,0x1b2251);
        }
        local_7c = local_7c + 1;
      }
      local_88 = local_70 << 6;
      while (local_78 != 0) {
        local_8c = 0;
        for (uVar3 = local_78; (uVar3 & 1) == 0; uVar3 = uVar3 >> 1 | 0x8000000000000000) {
          local_8c = local_8c + 1;
        }
        local_78 = local_78 & ~(1L << ((ulong)(byte)local_8c & 0x3f));
        directed_flag_complex_cell_t::insert_vertex
                  ((directed_flag_complex_cell_t *)
                   CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                   CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                   in_stack_fffffffffffffebe);
        in_stack_fffffffffffffed0 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
        vVar4 = directed_flag_complex_coboundary_cell_t::vertex(&local_b0,0);
        auVar2._2_6_ = 0;
        auVar2._0_2_ = vVar4;
        auVar1._8_8_ = 0;
        auVar1._0_8_ = *(ulong *)(in_RDI + 0xe);
        auVar2._8_8_ = in_stack_fffffffffffffed0;
        directed_flag_complex_coboundary_cell_t::directed_flag_complex_coboundary_cell_t
                  ((directed_flag_complex_coboundary_cell_t *)
                   CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                   (directed_flag_complex_coboundary_cell_t *)
                   CONCAT26(in_stack_fffffffffffffebe,
                            CONCAT24(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)));
        in_stack_ffffffffffffff00 =
             (directed_flag_complex_coboundary_cell_t *)
             directed_flag_complex_in_memory_t<std::pair<int,_float>_>::
             get_data<directed_flag_complex_coboundary_cell_t>
                       (in_stack_ffffffffffffff10,(int)(in_stack_ffffffffffffff08 >> 0x20),
                        in_stack_ffffffffffffff00);
        in_stack_fffffffffffffec8 =
             *(int *)&(in_stack_ffffffffffffff00->super_directed_flag_complex_cell_t).
                      _vptr_directed_flag_complex_cell_t;
        pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (*(vector<unsigned_long,_std::allocator<unsigned_long>_> **)(in_RDI + 10)
                            ,(long)SUB162(auVar2 % auVar1,0));
        in_stack_fffffffffffffecc = in_stack_fffffffffffffec8 + (int)*pvVar6;
        if ((local_68 & 1) == 0) {
          in_stack_fffffffffffffec4 = 1;
        }
        else {
          in_stack_fffffffffffffec4 = (short)in_RDI[0x10] + -1;
        }
        make_entry(in_stack_fffffffffffffecc,(coefficient_t)in_stack_fffffffffffffec4);
        compressed_sparse_matrix<int>::push_back
                  ((compressed_sparse_matrix<int> *)
                   CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                   CONCAT22(in_stack_fffffffffffffebe,in_stack_fffffffffffffebc));
      }
    }
  }
  *in_RDI = *in_RDI + 1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_stack_fffffffffffffed0);
  return;
}

Assistant:

void operator()(vertex_index_t* first_vertex, int size, std::pair<index_t, value_t>&) {
#ifdef INDICATE_PROGRESS
		if (is_first && (current_index + 1) % 10000 == 0) {
			std::cout << "\033[K"
			          << "dimension " << current_dimension << ": computed ca. " << nb_threads * (current_index + 1);
			if (total_cell_number > 0) std::cout << "/" << total_cell_number;
			std::cout << " coboundaries" << std::flush << "\r";
		}
#endif
		directed_flag_complex_cell_t cell(first_vertex);
		coboundary_matrix.append_column();

		std::vector<size_t> vertex_offsets;
		for (int j = 0; j < size; j++) vertex_offsets.push_back(first_vertex[j] >> 6);

		for (int i = 0; i <= size; i++) {
			// Check intersections in chunks of 64
			for (size_t offset = 0; offset < graph.incidence_row_length; offset++) {
				size_t bits = -1; // All bits set

				for (int j = 0; bits > 0 && j < size; j++) {
					// Remove the vertices already making up the cellk
					if (vertex_offsets[j] == offset) bits &= ~(ONE_ << (first_vertex[j] - (vertex_offsets[j] << 6)));

					// Intersect with the outgoing/incoming edges of the current
					// vertex
					bits &= j < i ? graph.get_outgoing_chunk(first_vertex[j], offset)
					              : graph.get_incoming_chunk(first_vertex[j], offset);
				}

				size_t vertex_offset = offset << 6;
				while (bits > 0) {
					// Get the least significant non-zero bit
					auto b = __builtin_ctzl(bits);

					// Unset this bit
					bits &= ~(ONE_ << b);

					// Now insert the appropriate vertex at this position
					auto cb = cell.insert_vertex(i, vertex_index_t(vertex_offset + b));
					short thread_index = cb.vertex(0) % nb_threads;
					coboundary_matrix.push_back(make_entry(complex.get_data(current_dimension + 1, cb).first +
					                                           index_t(cell_index_offsets[thread_index]),
					                                       index_t(i & 1 ? -1 + modulus : 1)));
				}
			}
		}

		current_index++;
	}